

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar3;
  string *psVar4;
  char *pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  allocator local_2b9;
  string local_2b8;
  char *local_298;
  char *linkCmd_2;
  allocator local_269;
  undefined1 local_268 [8];
  string linkCmdVar_2;
  string local_240;
  char *local_220;
  char *linkCmd_1;
  allocator local_1f1;
  undefined1 local_1f0 [8];
  string linkCmdVar_1;
  undefined1 local_1b0 [8];
  string cmakeCommand_1;
  string local_188;
  undefined1 local_168 [8];
  string targetOutputReal;
  undefined1 local_128 [8];
  string targetOutput;
  string cfgName;
  cmGeneratorTarget *gt;
  string cmakeCommand;
  string local_b8;
  allocator local_91;
  string local_90;
  char *local_70;
  char *linkCmd;
  string linkCmdVar;
  cmMakefile *mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  cmNinjaNormalTargetGenerator *this_local;
  
  linkCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&mf);
  this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)&linkCmd,pcVar3,&this->TargetLinkLanguage,psVar4);
  pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&linkCmd);
  local_70 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    cmakeCommand_1.field_2._12_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pcVar5,&local_91);
    cmSystemTools::ExpandListArgument
              (&local_90,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&mf,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b8,"LINK_WHAT_YOU_USE",
               (allocator *)(cmakeCommand.field_2._M_local_buf + 0xf));
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    if (bVar1) {
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&gt,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar4,SHELL);
      std::__cxx11::string::operator+=((string *)&gt," -E __run_iwyu --lwyu=");
      pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string
                ((string *)(targetOutput.field_2._M_local_buf + 8),(string *)psVar4);
      cmGeneratorTarget::GetFullPath
                ((string *)((long)&targetOutputReal.field_2 + 8),pcVar3,
                 (string *)((long)&targetOutput.field_2 + 8),RuntimeBinaryArtifact,false);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_128,&this->super_cmNinjaTargetGenerator,
                 (string *)((long)&targetOutputReal.field_2 + 8));
      std::__cxx11::string::~string((string *)(targetOutputReal.field_2._M_local_buf + 8));
      cmGeneratorTarget::GetFullPath
                (&local_188,pcVar3,(string *)((long)&targetOutput.field_2 + 8),RuntimeBinaryArtifact
                 ,true);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_168,&this->super_cmNinjaTargetGenerator,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::operator+=((string *)&gt,(string *)local_168);
      std::__cxx11::string::operator+=((string *)&gt," || true");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf,(value_type *)&gt);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)(targetOutput.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&gt);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&mf);
    cmakeCommand_1.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&linkCmd);
  if (cmakeCommand_1.field_2._12_4_ == 0) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar2 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar2 != EXECUTABLE) {
      if (TVar2 == STATIC_LIBRARY) {
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)local_1b0,
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,psVar4,SHELL);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&linkCmdVar_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0," -E remove $TARGET_FILE");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&mf,(value_type *)((long)&linkCmdVar_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(linkCmdVar_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1f0,"CMAKE_",&local_1f1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        std::__cxx11::string::operator+=((string *)local_1f0,(string *)&this->TargetLinkLanguage);
        std::__cxx11::string::operator+=((string *)local_1f0,"_ARCHIVE_CREATE");
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  ((string *)&linkCmd_1,pcVar3,(string *)local_1f0,&this->TargetLinkLanguage,psVar4)
        ;
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&linkCmd_1);
        std::__cxx11::string::~string((string *)&linkCmd_1);
        pcVar5 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_1f0);
        local_220 = pcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_240,pcVar5,
                   (allocator *)(linkCmdVar_2.field_2._M_local_buf + 0xf));
        cmSystemTools::ExpandListArgument
                  (&local_240,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&mf,false);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(linkCmdVar_2.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)local_1f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_268,"CMAKE_",&local_269);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        std::__cxx11::string::operator+=((string *)local_268,(string *)&this->TargetLinkLanguage);
        std::__cxx11::string::operator+=((string *)local_268,"_ARCHIVE_FINISH");
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  ((string *)&linkCmd_2,pcVar3,(string *)local_268,&this->TargetLinkLanguage,psVar4)
        ;
        std::__cxx11::string::operator=((string *)local_268,(string *)&linkCmd_2);
        std::__cxx11::string::~string((string *)&linkCmd_2);
        pcVar5 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_268);
        local_298 = pcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b8,pcVar5,&local_2b9);
        cmSystemTools::ExpandListArgument
                  (&local_2b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&mf,false);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        std::__cxx11::string::~string((string *)local_268);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&mf);
        cmakeCommand_1.field_2._12_4_ = 1;
        goto LAB_00677632;
      }
      if (1 < TVar2 - SHARED_LIBRARY) {
        __assert_fail("false && \"Unexpected target type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                      ,0x222,
                      "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd()");
      }
    }
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    cmakeCommand_1.field_2._12_4_ = 1;
  }
LAB_00677632:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd()
{
  std::vector<std::string> linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage, this->GetConfigName());
    const char* linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      cmSystemTools::ExpandListArgument(linkCmd, linkCmds);
      if (this->GetGeneratorTarget()->GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
        cmakeCommand += " -E __run_iwyu --lwyu=";
        cmGeneratorTarget& gt = *this->GetGeneratorTarget();
        const std::string cfgName = this->GetConfigName();
        std::string targetOutput = ConvertToNinjaPath(gt.GetFullPath(cfgName));
        std::string targetOutputReal = this->ConvertToNinjaPath(
          gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                         /*realname=*/true));
        cmakeCommand += targetOutputReal;
        cmakeCommand += " || true";
        linkCmds.push_back(cmakeCommand);
      }
      return linkCmds;
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E remove $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = "CMAKE_";
        linkCmdVar += this->TargetLinkLanguage;
        linkCmdVar += "_ARCHIVE_CREATE";

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage, this->GetConfigName());

        const char* linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmSystemTools::ExpandListArgument(linkCmd, linkCmds);
      }
      {
        std::string linkCmdVar = "CMAKE_";
        linkCmdVar += this->TargetLinkLanguage;
        linkCmdVar += "_ARCHIVE_FINISH";

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage, this->GetConfigName());

        const char* linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmSystemTools::ExpandListArgument(linkCmd, linkCmds);
      }
      return linkCmds;
    }
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::EXECUTABLE:
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return std::vector<std::string>();
}